

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_decoder.c
# Opt level: O3

lzma_ret delta_decode(lzma_coder_conflict *coder,lzma_allocator *allocator,uint8_t *in,
                     size_t *in_pos,size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,
                     lzma_action action)

{
  lzma_code_function_conflict p_Var1;
  size_t sVar2;
  anon_enum_32_conflict aVar3;
  lzma_ret lVar4;
  byte bVar5;
  ulong uVar6;
  uint8_t uVar7;
  size_t sVar8;
  
  p_Var1 = (coder->next).code;
  if (p_Var1 != (lzma_code_function_conflict)0x0) {
    sVar8 = *out_pos;
    lVar4 = (*p_Var1)((coder->next).coder,allocator,in,in_pos,in_size,out,out_pos,out_size,action);
    sVar2 = *out_pos;
    if (sVar2 != sVar8) {
      aVar3 = coder->sequence;
      bVar5 = (byte)coder->header_pos;
      do {
        uVar7 = out[sVar8] + coder->header[(ulong)(byte)((char)aVar3 + bVar5) - 7];
        out[sVar8] = uVar7;
        uVar6 = (ulong)bVar5;
        bVar5 = bVar5 - 1;
        coder->header[uVar6 - 7] = uVar7;
        sVar8 = sVar8 + 1;
      } while (sVar2 != sVar8);
      *(byte *)&coder->header_pos = bVar5;
    }
    return lVar4;
  }
  __assert_fail("coder->next.code != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/delta/delta_decoder.c"
                ,0x27,
                "lzma_ret delta_decode(lzma_coder *, lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
               );
}

Assistant:

static lzma_ret
delta_decode(lzma_coder *coder, lzma_allocator *allocator,
		const uint8_t *LZMA_RESTRICT in, size_t *LZMA_RESTRICT in_pos,
		size_t in_size, uint8_t *LZMA_RESTRICT out,
		size_t *LZMA_RESTRICT out_pos, size_t out_size, lzma_action action)
{
	const size_t out_start = *out_pos;
	lzma_ret ret;

	assert(coder->next.code != NULL);

	ret = coder->next.code(coder->next.coder, allocator,
			in, in_pos, in_size, out, out_pos, out_size,
			action);

	decode_buffer(coder, out + out_start, *out_pos - out_start);

	return ret;
}